

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_stream.c
# Opt level: O2

cio_error read_some_max(cio_io_stream *ios,cio_read_buffer *buffer,
                       cio_io_stream_read_handler_t handler,void *context)

{
  ulong uVar1;
  ulong __n;
  
  uVar1 = (long)buffer->end - (long)buffer->data;
  __n = (long)ios[1].close - (long)ios[1].write_some;
  if (uVar1 < __n) {
    __n = uVar1;
  }
  memcpy(buffer->data,ios[1].write_some + (long)ios[1].read_some,__n);
  ios[1].write_some = ios[1].write_some + __n;
  buffer->add_ptr = buffer->add_ptr + __n;
  (*handler)(ios,context,CIO_SUCCESS,buffer);
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error read_some_max(struct cio_io_stream *ios, struct cio_read_buffer *buffer, cio_io_stream_read_handler_t handler, void *context)
{
	struct memory_stream *memory_stream = cio_container_of(ios, struct memory_stream, ios);
	size_t len = CIO_MIN(cio_read_buffer_size(buffer), memory_stream->size - memory_stream->read_pos);
	memcpy(buffer->data, &((uint8_t *)memory_stream->mem)[memory_stream->read_pos], len);
	memory_stream->read_pos += len;
	buffer->add_ptr += len;
	handler(ios, context, CIO_SUCCESS, buffer);
	return CIO_SUCCESS;
}